

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::ZoneVector<asmjit::_abi_1_10::RABlock_*>::append
          (ZoneVector<asmjit::_abi_1_10::RABlock_*> *this,ZoneAllocator *allocator,RABlock **item)

{
  undefined8 *in_RDX;
  ZoneVector<asmjit::_abi_1_10::RABlock_*> *in_RDI;
  Error _err;
  ZoneAllocator *in_stack_ffffffffffffffc8;
  Error local_4;
  
  if (((in_RDI->super_ZoneVectorBase)._size != (in_RDI->super_ZoneVectorBase)._capacity) ||
     (local_4 = grow(in_RDI,in_stack_ffffffffffffffc8,0), local_4 == 0)) {
    *(undefined8 *)
     ((long)(in_RDI->super_ZoneVectorBase)._data + (ulong)(in_RDI->super_ZoneVectorBase)._size * 8)
         = *in_RDX;
    (in_RDI->super_ZoneVectorBase)._size = (in_RDI->super_ZoneVectorBase)._size + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ASMJIT_FORCE_INLINE Error append(ZoneAllocator* allocator, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_size == _capacity))
      ASMJIT_PROPAGATE(grow(allocator, 1));

    memcpy(static_cast<T*>(_data) + _size, &item, sizeof(T));
    _size++;

    return kErrorOk;
  }